

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall wasm::TranslateToFuzzReader::makeBrOn(TranslateToFuzzReader *this,Type type)

{
  uint uVar1;
  Type TVar2;
  BrOnOp BVar3;
  uint32_t uVar4;
  value_type *ppEVar5;
  Type TVar6;
  Expression *pEVar7;
  Expression *pEVar8;
  HeapType HVar9;
  ulong uVar10;
  Type type_00;
  TranslateToFuzzReader *this_00;
  int iVar11;
  Name NVar12;
  Type local_78;
  anon_class_16_2_3fee0b3d local_70;
  Type local_60;
  Type type_local;
  Type local_48;
  TranslateToFuzzReader *local_40;
  Type local_38;
  Type castType;
  
  local_60.id = type.id;
  if ((this->funcContext->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->funcContext->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
LAB_00147eed:
    pEVar8 = makeTrivial(this,type);
    return pEVar8;
  }
  local_40 = (TranslateToFuzzReader *)&this->random;
  iVar11 = (this->fuzzParams->super_FuzzParams).TRIES + 1;
  type_local.id = type.id;
  while( true ) {
    iVar11 = iVar11 + -1;
    type.id = type_local.id;
    if (iVar11 < 1) goto LAB_00147eed;
    this_00 = local_40;
    ppEVar5 = Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                        ((Random *)local_40,&this->funcContext->breakableStack);
    pEVar8 = *ppEVar5;
    NVar12 = getTargetName(this_00,pEVar8);
    local_70.this = this;
    if (pEVar8->_id != BlockId) break;
    TVar6.id = (pEVar8->type).id;
    if (6 < TVar6.id && (TVar6.id & 1) == 0) {
      local_70.type = &local_60;
      local_78.id = TVar6.id;
      BVar3 = Random::pick<wasm::BrOnOp,wasm::BrOnOp,wasm::BrOnOp>
                        ((Random *)local_40,BrOnNonNull,BrOnCast,BrOnCastFail);
      local_38.id = 0;
      type_local.id._0_4_ = BVar3;
      if (BVar3 == BrOnCastFail) {
        type_00 = getSubType(this,TVar6);
        local_48 = type_00;
        uVar4 = Random::upTo((Random *)local_40,5);
        if (uVar4 == 0) {
          local_38 = getSuperType(this,type_00);
        }
        else {
          local_38 = getSubType(this,type_00);
        }
        TVar2.id = local_48.id;
        if (((local_38.id & 3) == 0 && 6 < local_38.id) &&
           (uVar4 = Random::upTo((Random *)local_40,2), TVar2.id = local_48.id, uVar4 == 0)) {
          HVar9 = Type::getHeapType(&local_38);
          TVar6.id = local_38.id;
          if (((uint)(0x7c < HVar9.id) * 4 + 3 & (uint)HVar9.id) != 0) goto LAB_0014821d;
          local_38.id = HVar9.id | 2;
          TVar2.id = local_48.id;
        }
      }
      else if (BVar3 == BrOnCast) {
        local_38 = getSubType(this,TVar6);
        uVar4 = Random::upTo((Random *)local_40,5);
        if (uVar4 == 0) {
          type_00 = getSubType(this,local_38);
        }
        else {
          type_00 = getSuperType(this,local_38);
        }
        TVar2.id = type_00.id;
        if ((((TVar6.id & 2) == 0) && (type_00.id < 7 || (type_00.id & 3) != 0)) &&
           (local_38.id < 7 || (local_38.id & 3) != 0)) {
          local_48.id = type_00.id;
          uVar4 = Random::upTo((Random *)local_40,2);
          if (uVar4 == 0) {
            type_00.id = (uintptr_t)Type::getHeapType(&local_48);
            uVar1 = (uint)(0x7c < type_00.id) * 4 + 3 & (uint)type_00.id;
            HVar9.id = local_38.id;
            TVar2.id = type_00.id;
            TVar6.id = local_38.id;
          }
          else {
            HVar9 = Type::getHeapType(&local_38);
            uVar1 = (uint)(0x7c < HVar9.id) * 4 + 3 & (uint)HVar9.id;
            TVar2.id = local_48.id;
            TVar6.id = local_38.id;
          }
          local_38.id = HVar9.id;
          if (uVar1 != 0) goto LAB_0014821d;
        }
      }
      else {
        if (BVar3 != BrOnNonNull) {
          wasm::handle_unreachable
                    ("bad br_on op",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                     ,0x1350);
        }
        HVar9 = Type::getHeapType(&local_78);
        if ((((this->wasm->features).features & 0x400) == 0) ||
           (uVar4 = Random::upTo((Random *)local_40,2), uVar4 != 0)) {
          uVar10 = 2;
        }
        else {
          uVar10 = 0;
        }
        TVar6.id = local_38.id;
        if (((uint)(0x7c < HVar9.id) * 4 + 3 & (uint)HVar9.id) != 0) {
LAB_0014821d:
          local_38.id = TVar6.id;
          __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                        ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
        }
        type_00.id = uVar10 | HVar9.id;
        TVar2.id = type_00.id;
      }
      local_48.id = TVar2.id;
      pEVar7 = make(this,type_00);
      TVar6.id = local_38.id;
      pEVar8 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x38,8);
      pEVar8->_id = BrOnId;
      (pEVar8->type).id = 0;
      *(BrOnOp *)(pEVar8 + 1) = (BrOnOp)type_local.id;
      *(IString *)&pEVar8[1].type = NVar12.super_IString.str;
      pEVar8[2].type.id = (uintptr_t)pEVar7;
      *(uintptr_t *)(pEVar8 + 3) = TVar6.id;
      wasm::BrOn::finalize();
      goto LAB_001481de;
    }
    if (TVar6.id == 0) {
LAB_00147f0c:
      local_70.type = &local_60;
      TVar6 = getReferenceType(this);
      pEVar7 = make(this,TVar6);
      pEVar8 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x38,8);
      pEVar8->_id = BrOnId;
      (pEVar8->type).id = 0;
      *(undefined4 *)(pEVar8 + 1) = 0;
      *(IString *)&pEVar8[1].type = NVar12.super_IString.str;
      pEVar8[2].type.id = (uintptr_t)pEVar7;
      *(undefined8 *)(pEVar8 + 3) = 0;
      wasm::BrOn::finalize();
LAB_001481de:
      pEVar8 = makeBrOn::anon_class_16_2_3fee0b3d::operator()(&local_70,pEVar8);
      return pEVar8;
    }
  }
  if (pEVar8->_id != LoopId) {
    wasm::handle_unreachable
              ("unexpected expr type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0x15f4);
  }
  goto LAB_00147f0c;
}

Assistant:

Expression* TranslateToFuzzReader::makeBrOn(Type type) {
  if (funcContext->breakableStack.empty()) {
    return makeTrivial(type);
  }
  // We need to find a proper target to break to; try a few times. Finding the
  // target is harder than flowing out the proper type, so focus on the target,
  // and fix up the flowing type later. That is, once we find a target to break
  // to, we can then either drop ourselves or wrap ourselves in a block +
  // another value, so that we return the proper thing here (which is done below
  // in fixFlowingType).
  int tries = fuzzParams->TRIES;
  Name targetName;
  Type targetType;
  while (--tries >= 0) {
    auto* target = pick(funcContext->breakableStack);
    targetName = getTargetName(target);
    targetType = getTargetType(target);
    // We can send any reference type, or no value at all, but nothing else.
    if (targetType.isRef() || targetType == Type::none) {
      break;
    }
  }
  if (tries < 0) {
    return makeTrivial(type);
  }

  auto fixFlowingType = [&](Expression* brOn) -> Expression* {
    if (Type::isSubType(brOn->type, type)) {
      // Already of the proper type.
      return brOn;
    }
    if (type == Type::none) {
      // We just need to drop whatever it is.
      return builder.makeDrop(brOn);
    }
    // We need to replace the type with something else. Drop the BrOn if we need
    // to, and append a value with the proper type.
    if (brOn->type != Type::none) {
      brOn = builder.makeDrop(brOn);
    }
    return builder.makeSequence(brOn, make(type));
  };

  // We found something to break to. Figure out which BrOn variants we can
  // send.
  if (targetType == Type::none) {
    // BrOnNull is the only variant that sends no value.
    return fixFlowingType(
      builder.makeBrOn(BrOnNull, targetName, make(getReferenceType())));
  }

  // We are sending a reference type to the target. All other BrOn variants can
  // do that.
  assert(targetType.isRef());
  auto op = pick(BrOnNonNull, BrOnCast, BrOnCastFail);
  Type castType = Type::none;
  Type refType;
  switch (op) {
    case BrOnNonNull: {
      // The sent type is the non-nullable version of the reference, so any ref
      // of that type is ok, nullable or not.
      refType = Type(targetType.getHeapType(), getNullability());
      break;
    }
    case BrOnCast: {
      // The sent type is the heap type we cast to, with the input type's
      // nullability, so the combination of the two must be a subtype of
      // targetType.
      castType = getSubType(targetType);
      // The ref's type must be castable to castType, or we'd not validate. But
      // it can also be a subtype, which will trivially also succeed (so do that
      // more rarely). Pick subtypes rarely, as they make the cast trivial.
      refType = oneIn(5) ? getSubType(castType) : getSuperType(castType);
      if (targetType.isNonNullable()) {
        // And it must have the right nullability for the target, as mentioned
        // above: if the target type is non-nullable then either the ref or the
        // cast types must be.
        if (!refType.isNonNullable() && !castType.isNonNullable()) {
          // Pick one to make non-nullable.
          if (oneIn(2)) {
            refType = Type(refType.getHeapType(), NonNullable);
          } else {
            castType = Type(castType.getHeapType(), NonNullable);
          }
        }
      }
      break;
    }
    case BrOnCastFail: {
      // The sent type is the ref's type, with adjusted nullability (if the cast
      // allows nulls then no null can fail the cast, and what is sent is non-
      // nullable). First, pick a ref type that we can send to the target.
      refType = getSubType(targetType);
      // See above on BrOnCast, but flipped.
      castType = oneIn(5) ? getSuperType(refType) : getSubType(refType);
      // There is no nullability to adjust: if targetType is non-nullable then
      // both refType and castType are as well, as subtypes of it. But we can
      // also allow castType to be nullable (it is not sent to the target).
      if (castType.isNonNullable() && oneIn(2)) {
        castType = Type(castType.getHeapType(), Nullable);
      }
    } break;
    default: {
      WASM_UNREACHABLE("bad br_on op");
    }
  }
  return fixFlowingType(
    builder.makeBrOn(op, targetName, make(refType), castType));
}